

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int SetMotorPWMRequestRPLIDAR(RPLIDAR *pRPLIDAR,int pwm)

{
  uchar uVar1;
  int iVar2;
  undefined3 local_22;
  undefined1 uStack_1f;
  undefined2 local_1e;
  undefined1 auStack_1c [2];
  uchar reqbuf [6];
  int pwm_local;
  RPLIDAR *pRPLIDAR_local;
  
  _local_22 = CONCAT13((char)pwm,0x2f0a5);
  local_1e = (ushort)(byte)((uint)pwm >> 8);
  _auStack_1c = pwm;
  unique0x10000089 = pRPLIDAR;
  uVar1 = ComputeChecksumRPLIDAR((uchar *)&local_22,6);
  local_1e = CONCAT11(uVar1,(undefined1)local_1e);
  iVar2 = WriteAllRS232Port(&stack0xffffffffffffffe8->RS232Port,(uint8 *)&local_22,6);
  if (iVar2 == 0) {
    mSleep(500);
  }
  else {
    printf("Error writing data to a RPLIDAR. \n");
  }
  pRPLIDAR_local._4_4_ = (uint)(iVar2 != 0);
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int SetMotorPWMRequestRPLIDAR(RPLIDAR* pRPLIDAR, int pwm)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
	if (IS_FAIL(pRPLIDAR->drv->setMotorPWM((_u16)pwm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorPWM() failed. \n");
		return EXIT_FAILURE;
	}
#else
	if (SL_IS_FAIL(pRPLIDAR->drv->setMotorSpeed((sl_u16)pwm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorSpeed() failed. \n");
		return EXIT_FAILURE;
	}
#endif // FORCE_RPLIDAR_SDK_V1
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,SET_MOTOR_PWM_REQUEST_RPLIDAR,0x02,0,0,0};

	reqbuf[3] = (unsigned char)pwm;
	reqbuf[4] = (unsigned char)(pwm>>8);
	reqbuf[5] = ComputeChecksumRPLIDAR(reqbuf, sizeof(reqbuf));

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	mSleep(500);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}